

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

long hw_cpu_curr_freq(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  char *CPU_FREQ_SCALING_CUR_FREQ;
  char sys_devices_system_cpu [32];
  stat struct_stat;
  char *p;
  long val;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  stat local_a0;
  char *local_10;
  ulong local_8;
  
  local_8 = 0;
  iVar2 = stat("/sys/devices/system/cpu/cpu0/cpufreq/scaling_cur_freq",&local_a0);
  if ((iVar2 == 0) &&
     (iVar2 = slurpfile(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0), iVar2 != 0)) {
    local_10 = &stack0xffffffffffffff38;
    uVar3 = strtoul(local_10,(char **)0x0,10);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    local_8 = (ulong)SUB164(auVar1 / ZEXT816(1000),0);
  }
  return local_8;
}

Assistant:

long hw_cpu_curr_freq( void )
{
  long val = 0;
#ifdef HAVE_MAC_SYSCTL
  /* static int flag=0; */
  static int mib[2] = {CTL_HW, HW_CPU_FREQ};
  size_t vlen;
  /* if (flag == 0) { */
  /*   sysctlnametomib("hw.cpufrequency",mib,&mlen); */
  /*   printf("\nmib = { %i, %i, %i, %i};\n",mib[0],mib[1],mib[2],mib[3]); */
  /*   flag=1; */
  /* } */
  vlen = sizeof(long);
  sysctl(mib,2,&val,&vlen,NULL,0);
  val = val/1e6;
  
#else
  char *p;
  
  struct stat struct_stat;
  char sys_devices_system_cpu[32];
  const char *CPU_FREQ_SCALING_CUR_FREQ = "/sys/devices/system/cpu/cpu0/cpufreq/scaling_cur_freq";
  if ( stat(CPU_FREQ_SCALING_CUR_FREQ, &struct_stat) == 0 ) {
    if(slurpfile(CPU_FREQ_SCALING_CUR_FREQ, sys_devices_system_cpu, 32)) {
      p = sys_devices_system_cpu;
      val = (unsigned int) (strtoul( p, (char **)NULL , 10 ) / 1000 );
    }
  }
#endif //end HAVE_MAC_SYSCTL
  return val;
}